

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmXMLWriter *xml)

{
  cmGlobalGenerator *pcVar1;
  cmLocalGenerator *pcVar2;
  cmMakefile *this_00;
  cmGeneratorTarget *this_01;
  cmSourceFile *this_02;
  pointer ppcVar3;
  TargetType TVar4;
  string *psVar5;
  cmSourceGroup *this_03;
  pointer ppcVar6;
  pointer ppcVar7;
  pointer ppcVar8;
  string linkName2;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  string linkName;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  allocator<char> local_f1;
  cmExtraEclipseCDT4Generator *local_f0;
  string local_e8;
  _Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_c8;
  pointer local_b0;
  pointer local_a8;
  cmXMLWriter *local_a0;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *local_98;
  pointer local_90;
  string local_88;
  string local_68;
  allocator<char> local_48 [24];
  
  local_f0 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"[Targets]",(allocator<char> *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"virtual:/virtual",(allocator<char> *)&local_88);
  AppendLinkedResource(xml,&local_68,&local_e8,VirtualFolder);
  std::__cxx11::string::~string((string *)&local_e8);
  pcVar1 = (local_f0->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  local_b0 = (pcVar1->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppcVar6 = (pcVar1->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_a0 = xml;
  while (ppcVar6 != local_b0) {
    pcVar2 = *ppcVar6;
    this_00 = pcVar2->Makefile;
    local_90 = (pcVar2->GeneratorTargets).
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    local_98 = &this_00->SourceGroups;
    local_a8 = ppcVar6;
    for (ppcVar8 = (pcVar2->GeneratorTargets).
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar8 != local_90;
        ppcVar8 = ppcVar8 + 1) {
      this_01 = *ppcVar8;
      std::__cxx11::string::string((string *)&local_e8,(string *)&local_68);
      std::__cxx11::string::append((char *)&local_e8);
      TVar4 = cmGeneratorTarget::GetType(this_01);
      if (TVar4 < UTILITY) {
        cmGeneratorTarget::GetType(this_01);
        std::__cxx11::string::append((char *)&local_e8);
        cmGeneratorTarget::GetName_abi_cxx11_(this_01);
        std::__cxx11::string::append((string *)&local_e8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"virtual:/virtual",local_48);
        AppendLinkedResource(xml,&local_e8,&local_88,VirtualFolder);
        std::__cxx11::string::~string((string *)&local_88);
        if (local_f0->GenerateLinkedResources != false) {
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                    ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)local_48,local_98);
          local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,"CMAKE_BUILD_TYPE",&local_f1);
          psVar5 = cmMakefile::GetSafeDefinition(this_00,&local_88);
          cmGeneratorTarget::GetSourceFiles
                    (this_01,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_c8,
                     psVar5);
          std::__cxx11::string::~string((string *)&local_88);
          ppcVar3 = local_c8._M_impl.super__Vector_impl_data._M_finish;
          for (ppcVar7 = local_c8._M_impl.super__Vector_impl_data._M_start; xml = local_a0,
              ppcVar7 != ppcVar3; ppcVar7 = ppcVar7 + 1) {
            this_02 = *ppcVar7;
            psVar5 = cmSourceFile::GetFullPath(this_02,(string *)0x0);
            this_03 = cmMakefile::FindSourceGroup
                                (this_00,psVar5,
                                 (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)local_48);
            cmSourceGroup::AssignSource(this_03,this_02);
          }
          WriteGroups(local_f0,(vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)local_48,
                      &local_e8,local_a0);
          std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                    (&local_c8);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector
                    ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)local_48);
        }
      }
      std::__cxx11::string::~string((string *)&local_e8);
    }
    ppcVar6 = local_a8 + 1;
  }
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(cmXMLWriter& xml)
{
  std::string linkName = "[Targets]";
  cmExtraEclipseCDT4Generator::AppendLinkedResource(
    xml, linkName, "virtual:/virtual", VirtualFolder);

  for (cmLocalGenerator* lg : this->GlobalGenerator->GetLocalGenerators()) {
    cmMakefile* makefile = lg->GetMakefile();
    const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();

    for (cmGeneratorTarget* target : targets) {
      std::string linkName2 = linkName;
      linkName2 += "/";
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          const char* prefix =
            (target->GetType() == cmStateEnums::EXECUTABLE ? "[exe] "
                                                           : "[lib] ");
          linkName2 += prefix;
          linkName2 += target->GetName();
          cmExtraEclipseCDT4Generator::AppendLinkedResource(
            xml, linkName2, "virtual:/virtual", VirtualFolder);
          if (!this->GenerateLinkedResources) {
            break; // skip generating the linked resources to the source files
          }
          std::vector<cmSourceGroup> sourceGroups =
            makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          cmGeneratorTarget* gt = const_cast<cmGeneratorTarget*>(target);
          std::vector<cmSourceFile*> files;
          gt->GetSourceFiles(files,
                             makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (cmSourceFile* sf : files) {
            // Add the file to the list of sources.
            std::string const& source = sf->GetFullPath();
            cmSourceGroup* sourceGroup =
              makefile->FindSourceGroup(source, sourceGroups);
            sourceGroup->AssignSource(sf);
          }

          this->WriteGroups(sourceGroups, linkName2, xml);
        } break;
        // ignore all others:
        default:
          break;
      }
    }
  }
}